

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void * xmlCopyAttribute(void *payload,xmlChar *name)

{
  xmlEnumerationPtr pxVar1;
  xmlChar *pxVar2;
  xmlAttributePtr cur;
  xmlAttributePtr attr;
  xmlChar *name_local;
  void *payload_local;
  
  payload_local = (*xmlMalloc)(0x78);
  if (payload_local == (void *)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    payload_local = (void *)0x0;
  }
  else {
    memset(payload_local,0,0x78);
    *(undefined4 *)((long)payload_local + 8) = 0x10;
    *(undefined4 *)((long)payload_local + 0x50) = *(undefined4 *)((long)payload + 0x50);
    *(undefined4 *)((long)payload_local + 0x54) = *(undefined4 *)((long)payload + 0x54);
    pxVar1 = xmlCopyEnumeration(*(xmlEnumerationPtr *)((long)payload + 0x60));
    *(xmlEnumerationPtr *)((long)payload_local + 0x60) = pxVar1;
    if (*(long *)((long)payload + 0x70) != 0) {
      pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x70));
      *(xmlChar **)((long)payload_local + 0x70) = pxVar2;
    }
    if (*(long *)((long)payload + 0x10) != 0) {
      pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
      *(xmlChar **)((long)payload_local + 0x10) = pxVar2;
    }
    if (*(long *)((long)payload + 0x68) != 0) {
      pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
      *(xmlChar **)((long)payload_local + 0x68) = pxVar2;
    }
    if (*(long *)((long)payload + 0x58) != 0) {
      pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x58));
      *(xmlChar **)((long)payload_local + 0x58) = pxVar2;
    }
  }
  return payload_local;
}

Assistant:

static void *
xmlCopyAttribute(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlAttributePtr attr = (xmlAttributePtr) payload;
    xmlAttributePtr cur;

    cur = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (cur == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlAttribute));
    cur->type = XML_ATTRIBUTE_DECL;
    cur->atype = attr->atype;
    cur->def = attr->def;
    cur->tree = xmlCopyEnumeration(attr->tree);
    if (attr->elem != NULL)
	cur->elem = xmlStrdup(attr->elem);
    if (attr->name != NULL)
	cur->name = xmlStrdup(attr->name);
    if (attr->prefix != NULL)
	cur->prefix = xmlStrdup(attr->prefix);
    if (attr->defaultValue != NULL)
	cur->defaultValue = xmlStrdup(attr->defaultValue);
    return(cur);
}